

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O3

void __thiscall
SListBase<int,_Memory::ArenaAllocator,_RealCount>::RemoveHead
          (SListBase<int,_Memory::ArenaAllocator,_RealCount> *this,ArenaAllocator *allocator)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SListBase<int,_Memory::ArenaAllocator,_RealCount> *buffer;
  
  buffer = (SListBase<int,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  if (buffer == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x18b,"(!this->Empty())","!this->Empty()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    buffer = (SListBase<int,_Memory::ArenaAllocator,_RealCount> *)
             (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  }
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next =
       (buffer->super_SListNodeBase<Memory::ArenaAllocator>).next;
  Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
            (&allocator->super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>,
             buffer,0x10);
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void RemoveHead(TAllocator * allocator)
    {
        Assert(!this->Empty());

        NodeBase * node = this->Next();
        this->Next() = node->Next();

        auto freeFunc = TypeAllocatorFunc<TAllocator, TData>::GetFreeFunc();
        AllocatorFree(allocator, freeFunc, (Node *) node, sizeof(Node));
        this->DecrementCount();
    }